

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O2

void __thiscall rengine::AnimationManager::tick(AnimationManager *this)

{
  list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  iterator iVar3;
  
  p_Var2 = (_List_node_base *)(this->m_nextTick).__d.__r;
  iVar3._M_node =
       (this->m_scheduledAnimations).
       super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  (this->m_nextTick).__d.__r = (rep)(p_Var2 + 1000000);
  this_00 = &this->m_runningAnimations;
  while( true ) {
    if (iVar3._M_node == (_List_node_base *)&this->m_scheduledAnimations) {
      iVar3._M_node =
           (this_00->
           super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      while( true ) {
        if (iVar3._M_node == (_List_node_base *)this_00) {
          if ((this->m_runningAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
              ._M_impl._M_node._M_size == 0 &&
              (this->m_scheduledAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
              ._M_impl._M_node._M_size == 0) {
            setRunning(this,false);
            return;
          }
          return;
        }
        if (((ulong)iVar3._M_node[1]._M_prev[2]._M_next & 1) == 0) break;
        (*(code *)(iVar3._M_node[1]._M_prev)->_M_next[1]._M_next)
                  ((double)((long)p_Var2 - (long)iVar3._M_node[1]._M_next) / 1000000000.0);
        if (((ulong)iVar3._M_node[1]._M_prev[2]._M_next & 1) == 0) {
          Signal<>::emit(&AbstractAnimation::onCompleted,(SignalEmitter *)iVar3._M_node[1]._M_prev);
          iVar3 = std::__cxx11::
                  list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                  ::erase(this_00,iVar3._M_node);
        }
        else {
          iVar3._M_node = (iVar3._M_node)->_M_next;
        }
      }
      __assert_fail("ri->animation->isRunning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                    ,0x18d,"void rengine::AnimationManager::tick()");
    }
    if (((ulong)iVar3._M_node[1]._M_prev[2]._M_next & 1) != 0) break;
    if ((((value_type *)(iVar3._M_node + 1))->start).__d.__r < (long)p_Var2) {
      iVar3._M_node[1]._M_next = p_Var2;
      p_Var1 = iVar3._M_node[1]._M_prev + 2;
      *(byte *)&p_Var1->_M_next = *(byte *)&p_Var1->_M_next | 1;
      Signal<>::emit(&AbstractAnimation::onStarted,(SignalEmitter *)iVar3._M_node[1]._M_prev);
      std::__cxx11::
      list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
      ::push_back(this_00,(value_type *)(iVar3._M_node + 1));
      iVar3 = std::__cxx11::
              list<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
              ::erase(&this->m_scheduledAnimations,iVar3._M_node);
    }
    else {
      iVar3._M_node = (iVar3._M_node)->_M_next;
    }
  }
  __assert_fail("!si->animation->isRunning()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/animationsystem/animation.h"
                ,0x17e,"void rengine::AnimationManager::tick()");
}

Assistant:

inline void AnimationManager::tick()
{
    // alternatively:
    // time_point now = clock::now();
    time_point now = m_nextTick;
    m_nextTick += std::chrono::milliseconds(16);

    // std::cout << "AnimationManager::tick: scheduled=" << m_scheduledAnimations.size()
    //           << ", running=" << m_runningAnimations.size() << std::endl;

    // Start pending animations if we've passed beyond its starting point.
    // ### TODO: these should probably be sorted so animations start in the right order
    auto si = m_scheduledAnimations.begin();
    while (si != m_scheduledAnimations.end()) {
        assert(!si->animation->isRunning());
        if (si->start < now) {
            // Make sure we start at t=0
            si->start = now;
            si->animation->setRunning(true);
            AbstractAnimation::onStarted.emit(si->animation.get());
            m_runningAnimations.push_back(*si);
            si = m_scheduledAnimations.erase(si);
        } else {
            ++si;
        }
    }

    auto ri = m_runningAnimations.begin();
    while (ri != m_runningAnimations.end()) {
        assert(ri->animation->isRunning());
        std::chrono::duration<double> animTime = now - ri->start;
        ri->animation->tick(animTime.count());
        if (!ri->animation->isRunning()) {
            AbstractAnimation::onCompleted.emit(ri->animation.get());
            ri = m_runningAnimations.erase(ri);
        } else {
            ++ri;
        }
    }

    if (m_scheduledAnimations.size() == 0 && m_runningAnimations.size() == 0)
        setRunning(false);
}